

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string *psVar4;
  pointer pcVar5;
  pointer pcVar6;
  reference pbVar7;
  pointer pcVar8;
  string_view val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_34c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3470;
  string local_33e8;
  undefined1 local_33c8 [8];
  ostringstream msg_2;
  int local_3250;
  allocator<char> local_3249;
  int result_2;
  int local_3224;
  iterator iStack_3220;
  int result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3218;
  undefined1 local_3210 [8];
  string out_oldest;
  iterator out;
  string local_31e0;
  int local_31bc;
  iterator iStack_31b8;
  int result;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_31b0;
  undefined1 local_31a8 [8];
  string dep_newest;
  iterator dep;
  string local_3178;
  allocator<char> local_3151;
  string local_3150;
  string *local_3130;
  undefined1 local_3128 [8];
  cmList outputs;
  string local_3108;
  cmValue local_30e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30d8;
  iterator local_30b8;
  size_type local_30b0;
  undefined1 local_30a8 [8];
  cmList depends;
  string local_3088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  string local_3040;
  cmValue local_3020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3010;
  iterator local_2ff0;
  size_type local_2fe8;
  undefined1 local_2fe0 [8];
  cmList products;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lgd;
  undefined1 local_2fa8 [8];
  cmMakefile mfd;
  undefined1 local_21d0 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> ggd;
  string local_21b0;
  string local_2190 [8];
  string genName;
  string local_2168;
  undefined1 local_2148 [8];
  ostringstream msg_1;
  cmStateSnapshot local_1fd0;
  undefined1 local_1fb8 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  undefined1 local_a98 [8];
  cmake cm;
  ostringstream local_1d0 [8];
  ostringstream msg;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  cmake *pcStack_18;
  bool verbose;
  cmake *this_local;
  
  pcStack_18 = this;
  local_19 = isCMakeVerbose();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
    if (bVar1) {
      cmake((cmake *)local_a98,RoleScript,Unknown,Normal);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"",&local_ab9);
      SetHomeDirectory((cmake *)local_a98,&local_ab8);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::allocator<char>::~allocator(&local_ab9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"",&local_ae1);
      SetHomeOutputDirectory((cmake *)local_a98,&local_ae0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::allocator<char>::~allocator(&local_ae1);
      GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_a98);
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
      cmGlobalGenerator::cmGlobalGenerator
                ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_a98);
      GetCurrentSnapshot(&local_1fd0,(cmake *)local_a98);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_1fb8,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
                 &local_1fd0);
      bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_1fb8,&this->CheckBuildSystemArgument);
      if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccurredFlag(), bVar1)) {
        if ((local_19 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2148);
          poVar3 = std::operator<<((ostream *)local_2148,"Re-run cmake error reading : ");
          poVar3 = std::operator<<(poVar3,(string *)&this->CheckBuildSystemArgument);
          std::operator<<(poVar3,'\n');
          std::__cxx11::ostringstream::str();
          cmSystemTools::Stdout(&local_2168);
          std::__cxx11::string::~string((string *)&local_2168);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2148);
        }
        this_local._4_4_ = 1;
        genName.field_2._12_4_ = 1;
      }
      else {
        if ((this->ClearBuildSystem & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_21b0,"CMAKE_DEPENDS_GENERATOR",
                     (allocator<char> *)&stack0xffffffffffffde4f);
          psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)local_1fb8,&local_21b0);
          std::__cxx11::string::string(local_2190,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_21b0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffde4f);
          val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_2190);
          ggd._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
          ._M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>
                )val._M_len;
          bVar1 = cmNonempty(val);
          if (!bVar1) {
            std::__cxx11::string::operator=(local_2190,"Unix Makefiles");
          }
          CreateGlobalGenerator((cmake *)local_21d0,(string *)this,SUB81(local_2190,0));
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_21d0);
          if (bVar1) {
            GetCurrentSnapshot((cmStateSnapshot *)&mfd.IsSourceFileTryCompile,(cmake *)local_a98);
            cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mfd.IsSourceFileTryCompile);
            pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     get((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                         local_21d0);
            GetCurrentSnapshot((cmStateSnapshot *)&lgd,(cmake *)local_a98);
            cmMakefile::cmMakefile((cmMakefile *)local_2fa8,pcVar5,(cmStateSnapshot *)&lgd);
            pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                     operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 *)local_21d0);
            (*pcVar5->_vptr_cmGlobalGenerator[2])
                      (&products.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,local_2fa8);
            pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                     operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                 *)&products.Values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            (*(pcVar6->super_cmOutputConverter)._vptr_cmOutputConverter[0xc])
                      (pcVar6,local_2fa8,(ulong)(local_19 & 1));
            std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
                      ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                       &products.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmMakefile::~cmMakefile((cmMakefile *)local_2fa8);
          }
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                    ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                     local_21d0);
          std::__cxx11::string::~string(local_2190);
        }
        __range1._6_1_ = 1;
        local_3018 = &local_3010;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3040,"CMAKE_MAKEFILE_PRODUCTS",
                   (allocator<char> *)((long)&__range1 + 7));
        local_3020 = cmMakefile::GetDefinition((cmMakefile *)local_1fb8,&local_3040);
        psVar4 = cmValue::operator_cast_to_string_(&local_3020);
        std::__cxx11::string::string((string *)&local_3010,(string *)psVar4);
        __range1._6_1_ = 0;
        local_2ff0 = &local_3010;
        local_2fe8 = 1;
        init_00._M_len = 1;
        init_00._M_array = local_2ff0;
        cmList::cmList((cmList *)local_2fe0,init_00);
        local_3470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_2ff0;
        do {
          local_3470 = local_3470 + -1;
          std::__cxx11::string::~string((string *)local_3470);
        } while (local_3470 != &local_3010);
        std::__cxx11::string::~string((string *)&local_3040);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        __end1 = cmList::begin_abi_cxx11_((cmList *)local_2fe0);
        p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cmList::end_abi_cxx11_((cmList *)local_2fe0);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&p), bVar1) {
          local_3068 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end1);
          bVar1 = cmsys::SystemTools::PathExists(local_3068);
          if (!bVar1) {
            if ((local_19 & 1) != 0) {
              depends.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 10;
              cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char>
                        (&local_3088,(char (*) [34])"Re-run cmake, missing byproduct: ",local_3068,
                         (char *)((long)&depends.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmSystemTools::Stdout(&local_3088);
              std::__cxx11::string::~string((string *)&local_3088);
            }
            this_local._4_4_ = 1;
            genName.field_2._12_4_ = 1;
            goto LAB_006ff1be;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        outputs.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        local_30e0 = &local_30d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3108,"CMAKE_MAKEFILE_DEPENDS",
                   (allocator<char> *)
                   ((long)&outputs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_30e8 = cmMakefile::GetDefinition((cmMakefile *)local_1fb8,&local_3108);
        psVar4 = cmValue::operator_cast_to_string_(&local_30e8);
        std::__cxx11::string::string((string *)&local_30d8,(string *)psVar4);
        outputs.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        local_30b8 = &local_30d8;
        local_30b0 = 1;
        init._M_len = 1;
        init._M_array = local_30b8;
        cmList::cmList((cmList *)local_30a8,init);
        local_34c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_30b8;
        do {
          local_34c8 = local_34c8 + -1;
          std::__cxx11::string::~string((string *)local_34c8);
        } while (local_34c8 != &local_30d8);
        std::__cxx11::string::~string((string *)&local_3108);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&outputs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmList::cmList((cmList *)local_3128);
        bVar1 = cmList::empty((cmList *)local_30a8);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3150,"CMAKE_MAKEFILE_OUTPUTS",&local_3151);
          local_3130 = (string *)cmMakefile::GetDefinition((cmMakefile *)local_1fb8,&local_3150);
          cmList::assign((cmList *)local_3128,(cmValue)local_3130,Yes,No);
          std::__cxx11::string::~string((string *)&local_3150);
          std::allocator<char>::~allocator(&local_3151);
        }
        bVar1 = cmList::empty((cmList *)local_30a8);
        if ((bVar1) || (bVar1 = cmList::empty((cmList *)local_3128), bVar1)) {
          if ((local_19 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3178,
                       "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n",
                       (allocator<char> *)((long)&dep._M_current + 7));
            cmSystemTools::Stdout(&local_3178);
            std::__cxx11::string::~string((string *)&local_3178);
            std::allocator<char>::~allocator((allocator<char> *)((long)&dep._M_current + 7));
          }
          this_local._4_4_ = 1;
          genName.field_2._12_4_ = 1;
        }
        else {
          dep_newest.field_2._8_8_ = cmList::begin_abi_cxx11_((cmList *)local_30a8);
          local_31b0 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8),0);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_31b0);
          std::__cxx11::string::string((string *)local_31a8,(string *)pbVar7);
          while( true ) {
            iStack_31b8 = cmList::end_abi_cxx11_((cmList *)local_30a8);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&dep_newest.field_2 + 8),&stack0xffffffffffffce48);
            if (!bVar1) break;
            local_31bc = 0;
            pcVar8 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                     operator->(&this->FileTimeCache);
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&dep_newest.field_2 + 8));
            bVar1 = cmFileTimeCache::Compare(pcVar8,(string *)local_31a8,pbVar7,&local_31bc);
            if (!bVar1) {
              if ((local_19 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_31e0,
                           "Re-run cmake: build system dependency is missing\n",
                           (allocator<char> *)((long)&out._M_current + 7));
                cmSystemTools::Stdout(&local_31e0);
                std::__cxx11::string::~string((string *)&local_31e0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&out._M_current + 7));
              }
              this_local._4_4_ = 1;
              genName.field_2._12_4_ = 1;
              goto LAB_006ff16e;
            }
            if (local_31bc < 0) {
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&dep_newest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_31a8,(string *)pbVar7);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
          }
          out_oldest.field_2._8_8_ = cmList::begin_abi_cxx11_((cmList *)local_3128);
          local_3218 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8),0);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_3218);
          std::__cxx11::string::string((string *)local_3210,(string *)pbVar7);
          while( true ) {
            iStack_3220 = cmList::end_abi_cxx11_((cmList *)local_3128);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&out_oldest.field_2 + 8),&stack0xffffffffffffcde0);
            if (!bVar1) break;
            local_3224 = 0;
            pcVar8 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                     operator->(&this->FileTimeCache);
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&out_oldest.field_2 + 8));
            bVar1 = cmFileTimeCache::Compare(pcVar8,(string *)local_3210,pbVar7,&local_3224);
            if (!bVar1) {
              if ((local_19 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&result_2,"Re-run cmake: build system output is missing\n",
                           &local_3249);
                cmSystemTools::Stdout((string *)&result_2);
                std::__cxx11::string::~string((string *)&result_2);
                std::allocator<char>::~allocator(&local_3249);
              }
              this_local._4_4_ = 1;
              goto LAB_006ff152;
            }
            if (0 < local_3224) {
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&out_oldest.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_3210,(string *)pbVar7);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
          }
          local_3250 = 0;
          pcVar8 = std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::
                   operator->(&this->FileTimeCache);
          bVar1 = cmFileTimeCache::Compare
                            (pcVar8,(string *)local_3210,(string *)local_31a8,&local_3250);
          if ((bVar1) && (-1 < local_3250)) {
            this_local._4_4_ = 0;
          }
          else {
            if ((local_19 & 1) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_33c8);
              poVar3 = std::operator<<((ostream *)local_33c8,"Re-run cmake file: ");
              poVar3 = std::operator<<(poVar3,(string *)local_3210);
              poVar3 = std::operator<<(poVar3," older than: ");
              poVar3 = std::operator<<(poVar3,(string *)local_31a8);
              std::operator<<(poVar3,'\n');
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout(&local_33e8);
              std::__cxx11::string::~string((string *)&local_33e8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_33c8);
            }
            this_local._4_4_ = 1;
          }
LAB_006ff152:
          genName.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_3210);
LAB_006ff16e:
          std::__cxx11::string::~string((string *)local_31a8);
        }
        cmList::~cmList((cmList *)local_3128);
        cmList::~cmList((cmList *)local_30a8);
LAB_006ff1be:
        cmList::~cmList((cmList *)local_2fe0);
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_1fb8);
      cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
      ~cmake((cmake *)local_a98);
    }
    else {
      if ((local_19 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar3 = std::operator<<((ostream *)local_1d0,"Re-run cmake missing file: ");
        poVar3 = std::operator<<(poVar3,(string *)&this->CheckBuildSystemArgument);
        std::operator<<(poVar3,'\n');
        std::__cxx11::ostringstream::str();
        cmSystemTools::Stdout((string *)&cm.ScriptModeExitCode);
        std::__cxx11::string::~string((string *)&cm.ScriptModeExitCode);
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    if ((local_19 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Re-run cmake no build system arguments\n",&local_41);
      cmSystemTools::Stdout(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no build system arguments\n");
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    std::string genName = mf.GetSafeDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!cmNonempty(genName)) {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd =
      this->CreateGlobalGenerator(genName);
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      auto lgd = ggd->CreateLocalGenerator(&mfd);
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  cmList products{ mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS") };
  for (auto const& p : products) {
    if (!cmSystemTools::PathExists(p)) {
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Re-run cmake, missing byproduct: ", p, '\n'));
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  cmList depends{ mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS") };
  cmList outputs;
  if (!depends.empty()) {
    outputs.assign(mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS"));
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
                            "or CMAKE_MAKEFILE_OUTPUTS :\n");
    }
    return 1;
  }

  // Find the newest dependency.
  auto dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system dependency is missing\n");
      }
      return 1;
    }
  }

  // Find the oldest output.
  auto out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system output is missing\n");
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << '\n';
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}